

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::GetWitnessStackNumRequest,cfd::js::api::json::GetWitnessStackNumResponse,cfd::js::api::GetWitnessStackNumRequestStruct,cfd::js::api::GetWitnessStackNumResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  string *json_message;
  GetWitnessStackNumResponse res;
  GetWitnessStackNumRequestStruct request;
  GetWitnessStackNumRequest req;
  undefined1 local_328 [16];
  _Alloc_hider local_318;
  char local_308 [16];
  _Alloc_hider local_2f8;
  undefined1 local_2f0 [64];
  _Alloc_hider local_2b0;
  undefined1 auStack_2a8 [8];
  _Rb_tree_node_base local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 local_270 [16];
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  string local_1c0;
  GetWitnessStackNumRequestStruct local_1a0;
  GetWitnessStackNumRequest local_f0;
  
  GetWitnessStackNumRequest::GetWitnessStackNumRequest(&local_f0);
  core::JsonClassBase<cfd::js::api::json::GetWitnessStackNumRequest>::Deserialize
            (&local_f0.super_JsonClassBase<cfd::js::api::json::GetWitnessStackNumRequest>,
             (string *)this);
  GetWitnessStackNumRequest::ConvertToStruct(&local_1a0,&local_f0);
  local_270._0_4_ = 0;
  local_270._8_4_ = 0;
  local_260._M_p = (pointer)&local_250;
  local_258 = 0;
  local_250._M_local_buf[0] = '\0';
  local_240._M_p = (pointer)&local_230;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  p_Var1 = &local_220._M_impl.super__Rb_tree_header;
  local_220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_220._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_1f0._M_impl.super__Rb_tree_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_220._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_220._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_1a0.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f4cfe:
      uVar4 = std::__throw_bad_function_call();
      local_328._0_8_ = &PTR__GetWitnessStackNumResponse_00a7db58;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_328 + 8));
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((_Rb_tree_header *)pcVar3 != p_Var2) {
        operator_delete(pcVar3);
      }
      GetWitnessStackNumResponseStruct::~GetWitnessStackNumResponseStruct
                ((GetWitnessStackNumResponseStruct *)local_270);
      GetWitnessStackNumRequestStruct::~GetWitnessStackNumRequestStruct(&local_1a0);
      GetWitnessStackNumRequest::~GetWitnessStackNumRequest(&local_f0);
      _Unwind_Resume(uVar4);
    }
    (*bitcoin_function->_M_invoker)
              ((GetWitnessStackNumResponseStruct *)local_328,(_Any_data *)bitcoin_function,
               &local_1a0);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f4cfe;
    (**(code **)((long)&request_message->field_2 + 8))(local_328,request_message,&local_1a0);
  }
  local_270._0_4_ = local_328._0_4_;
  local_270._8_4_ = local_328._8_4_;
  std::__cxx11::string::operator=((string *)&local_260,(string *)&local_318);
  std::__cxx11::string::operator=((string *)&local_240,(string *)&local_2f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_220);
  if ((_Base_ptr)local_2f0._40_8_ != (_Base_ptr)0x0) {
    local_220._M_impl.super__Rb_tree_header._M_header._M_color = local_2f0._32_4_;
    local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2f0._40_8_;
    local_220._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_2f0._48_8_;
    local_220._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_2f0._56_8_;
    *(_Rb_tree_header **)(local_2f0._40_8_ + 8) = p_Var1;
    local_220._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_2b0._M_p;
    local_2f0._40_8_ = (_Base_ptr)0x0;
    local_2b0._M_p = (pointer)0x0;
    local_2f0._48_8_ = (_Base_ptr)(local_2f0 + 0x20);
    local_2f0._56_8_ = (_Base_ptr)(local_2f0 + 0x20);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_1f0);
  if (local_2a0._M_parent != (_Base_ptr)0x0) {
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = local_2a0._M_color;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = local_2a0._M_parent;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = local_2a0._M_left;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_right = local_2a0._M_right;
    *(_Rb_tree_header **)((long)local_2a0._M_parent + 8) = p_Var2;
    local_1f0._M_impl.super__Rb_tree_header._M_node_count = local_280._M_allocated_capacity;
    local_2a0._M_parent = (_Base_ptr)0x0;
    local_280._M_allocated_capacity = 0;
    local_2a0._M_left = &local_2a0;
    local_2a0._M_right = &local_2a0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_2a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 0x18));
  if (local_2f8._M_p != local_2f0 + 8) {
    operator_delete(local_2f8._M_p);
  }
  if (local_318._M_p != local_308) {
    operator_delete(local_318._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_270._8_4_ == 0) {
    GetWitnessStackNumResponse::GetWitnessStackNumResponse((GetWitnessStackNumResponse *)local_328);
    GetWitnessStackNumResponse::ConvertFromStruct
              ((GetWitnessStackNumResponse *)local_328,(GetWitnessStackNumResponseStruct *)local_270
              );
    core::JsonClassBase<cfd::js::api::json::GetWitnessStackNumResponse>::Serialize_abi_cxx11_
              (&local_1c0,(JsonClassBase<cfd::js::api::json::GetWitnessStackNumResponse> *)local_328
              );
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    local_328._0_8_ = &PTR__GetWitnessStackNumResponse_00a7db58;
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_328,(InnerErrorResponseStruct *)(local_270 + 8));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_1c0,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_328);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    local_328._0_8_ = &PTR__ErrorResponseBase_00a78a38;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_2f0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_p != &local_230) {
    operator_delete(local_240._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p != &local_250) {
    operator_delete(local_260._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1a0.ignore_items._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1a0.txin.ignore_items._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.txin.txid._M_dataplus._M_p != &local_1a0.txin.txid.field_2) {
    operator_delete(local_1a0.txin.txid._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.tx._M_dataplus._M_p != &local_1a0.tx.field_2) {
    operator_delete(local_1a0.tx._M_dataplus._M_p);
  }
  GetWitnessStackNumRequest::~GetWitnessStackNumRequest(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}